

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O3

void __thiscall
BamTools::Internal::BamStandardIndex::SaveLinearOffsetEntry
          (BamStandardIndex *this,BaiLinearOffsetVector *offsets,int *alignmentStartPosition,
          int *alignmentStopPosition,uint64_t *lastOffset)

{
  int iVar1;
  pointer puVar2;
  long lVar3;
  int iVar4;
  value_type_conflict2 local_28;
  
  iVar1 = *alignmentStartPosition;
  iVar4 = *alignmentStopPosition + -1 >> 0xe;
  if ((int)((ulong)((long)(offsets->
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                          .super__Vector_impl_data._M_finish -
                   (long)(offsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         )._M_impl.super__Vector_impl_data._M_start) >> 3) <= iVar4) {
    local_28 = 0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (offsets,(long)(iVar4 + 1),&local_28);
  }
  if (iVar1 >> 0xe < iVar4) {
    puVar2 = (offsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar3 = (long)(iVar1 >> 0xe);
    do {
      if (puVar2[lVar3 + 1] == 0) {
        puVar2[lVar3 + 1] = *lastOffset;
      }
      lVar3 = lVar3 + 1;
    } while (iVar4 != lVar3);
  }
  return;
}

Assistant:

void BamStandardIndex::SaveLinearOffsetEntry(BaiLinearOffsetVector& offsets,
                                             const int& alignmentStartPosition,
                                             const int& alignmentStopPosition,
                                             const uint64_t& lastOffset)
{
    // get converted offsets
    const int beginOffset = alignmentStartPosition >> BamStandardIndex::BAM_LIDX_SHIFT;
    const int endOffset = (alignmentStopPosition - 1) >> BamStandardIndex::BAM_LIDX_SHIFT;

    // resize vector if necessary
    int oldSize = offsets.size();
    int newSize = endOffset + 1;
    if (oldSize < newSize) offsets.resize(newSize, 0);

    // store offset
    for (int i = beginOffset + 1; i <= endOffset; ++i) {
        if (offsets[i] == 0) offsets[i] = lastOffset;
    }
}